

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

AActor * RoughBlockCheck(AActor *mo,int index,void *param)

{
  FBlockNode *pFVar1;
  bool bVar2;
  AActor *target;
  
  pFVar1 = blocklinks[index];
  do {
    if (pFVar1 == (FBlockNode *)0x0) {
      return (AActor *)0x0;
    }
    target = pFVar1->Me;
    if (target != mo) {
      if (param != (void *)0x0) {
        bVar2 = AActor::CanSeek(mo,target);
        if (!bVar2) goto LAB_005493e6;
        target = pFVar1->Me;
      }
      bVar2 = AActor::IsOkayToAttack(mo,target);
      if (bVar2) {
        return pFVar1->Me;
      }
    }
LAB_005493e6:
    pFVar1 = pFVar1->NextActor;
  } while( true );
}

Assistant:

static AActor *RoughBlockCheck (AActor *mo, int index, void *param)
{
	bool onlyseekable = param != NULL;
	FBlockNode *link;

	for (link = blocklinks[index]; link != NULL; link = link->NextActor)
	{
		if (link->Me != mo)
		{
			if (onlyseekable && !mo->CanSeek(link->Me))
			{
				continue;
			}
			if (mo->IsOkayToAttack (link->Me))
			{
				return link->Me;
			}
		}
	}
	return NULL;
}